

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Num.cpp
# Opt level: O2

Num * __thiscall Num::operator-(Num *__return_storage_ptr__,Num *this,Num *n2)

{
  ushort length;
  Byte BVar1;
  Num *this_00;
  Short i;
  ulong uVar2;
  Byte carry;
  Byte local_34;
  
  length = (ushort)*(undefined4 *)n2;
  if ((ushort)*(undefined4 *)n2 < (ushort)*(undefined4 *)this) {
    length = (ushort)*(undefined4 *)this;
  }
  this_00 = __return_storage_ptr__;
  Num(__return_storage_ptr__,length,0);
  local_34 = 0;
  for (uVar2 = 0; length != uVar2; uVar2 = uVar2 + 1) {
    BVar1 = 0;
    this_00 = (Num *)0x0;
    if (uVar2 < (ushort)(this->base)._M_string_length) {
      this_00 = (Num *)(ulong)((int)(this->base)._M_dataplus._M_p[uVar2] - 0x30);
    }
    if (uVar2 < (ushort)(n2->base)._M_string_length) {
      BVar1 = (int)(n2->base)._M_dataplus._M_p[uVar2] - 0x30;
    }
    BVar1 = Multiplicator::baseSubstraction((Byte)this_00,BVar1,&local_34);
    __return_storage_ptr__->size = (Short)uVar2;
    (__return_storage_ptr__->base)._M_dataplus._M_p[uVar2] = (char)BVar1 + '0';
  }
  delereZeros(this_00,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Num  Num::operator-(const Num& n2)
{
    Short m = std::max(size, n2.size);
    Num result(m, 0);
    Byte carry = 0;
    for (Short i = 0; i < m; ++i)
    {
        Byte dig = Multiplicator::baseSubstraction(getDigit(i), n2.getDigit(i), carry);
        result.setDigit(i, dig);
    }
    delereZeros(result);
    return result;
}